

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O2

bool __thiscall
BGParseManager::Process(BGParseManager *this,Job *job,ParallelThreadData *threadData)

{
  code *pcVar1;
  bool bVar2;
  BGParseManager *pBVar3;
  undefined4 *puVar4;
  ThreadContext *threadContext;
  ScriptContext *pSVar5;
  
  pBVar3 = (BGParseManager *)JsUtil::Job::Manager(job);
  if (pBVar3 != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
                       ,0x15d,"(job->Manager() == this)","job->Manager() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  threadContext = ThreadBoundThreadContextManager::EnsureContextForCurrentThread();
  pSVar5 = threadData->scriptContextBG;
  if (pSVar5 == (ScriptContext *)0x0) {
    pSVar5 = Js::ScriptContext::New(threadContext);
    threadData->scriptContextBG = pSVar5;
    Js::ScriptContext::Initialize(pSVar5);
    threadData->canDecommit = true;
    pSVar5 = threadData->scriptContextBG;
  }
  BGParseWorkItem::ParseUTF8Core((BGParseWorkItem *)job,pSVar5);
  return true;
}

Assistant:

bool BGParseManager::Process(JsUtil::Job *const job, JsUtil::ParallelThreadData *threadData) 
{
#if ENABLE_BACKGROUND_JOB_PROCESSOR
    Assert(job->Manager() == this);
    
    // Create script context on this thread
    ThreadContext* threadContext = ThreadBoundThreadContextManager::EnsureContextForCurrentThread();

    // If there is no script context created for this thread yet, create it now
    if (threadData->scriptContextBG == nullptr)
    {
        threadData->scriptContextBG = Js::ScriptContext::New(threadContext);
        threadData->scriptContextBG->Initialize();
        threadData->canDecommit = true;
    }
    
    // Parse the workitem's data
    BGParseWorkItem* workItem = (BGParseWorkItem*)job;
    workItem->ParseUTF8Core(threadData->scriptContextBG);

    return true;
#else
    Assert(!"BGParseManager does not work without ThreadContext");
    return false;
#endif
}